

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

CURLcode Curl_client_write(Curl_easy *data,int type,char *buf,size_t blen)

{
  CURLcode result;
  size_t blen_local;
  char *buf_local;
  int type_local;
  Curl_easy *data_local;
  
  if ((((((data->req).writer_stack != (Curl_cwriter *)0x0) ||
        (data_local._4_4_ = do_init_writer_stack(data), data_local._4_4_ == CURLE_OK)) &&
       (data_local._4_4_ = Curl_cwriter_write(data,(data->req).writer_stack,type,buf,blen),
       data != (Curl_easy *)0x0)) &&
      (((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0 &&
       (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))))) &&
     (0 < Curl_trc_feat_write.log_level)) {
    Curl_trc_write(data,"client_write(type=%x, len=%zu) -> %d",(ulong)(uint)type,blen,
                   (ulong)data_local._4_4_);
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_client_write(struct Curl_easy *data,
                           int type, const char *buf, size_t blen)
{
  CURLcode result;

  /* it is one of those, at least */
  DEBUGASSERT(type & (CLIENTWRITE_BODY|CLIENTWRITE_HEADER|CLIENTWRITE_INFO));
  /* BODY is only BODY (with optional EOS) */
  DEBUGASSERT(!(type & CLIENTWRITE_BODY) ||
              ((type & ~(CLIENTWRITE_BODY|CLIENTWRITE_EOS)) == 0));
  /* INFO is only INFO (with optional EOS) */
  DEBUGASSERT(!(type & CLIENTWRITE_INFO) ||
              ((type & ~(CLIENTWRITE_INFO|CLIENTWRITE_EOS)) == 0));

  if(!data->req.writer_stack) {
    result = do_init_writer_stack(data);
    if(result)
      return result;
    DEBUGASSERT(data->req.writer_stack);
  }

  result = Curl_cwriter_write(data, data->req.writer_stack, type, buf, blen);
  CURL_TRC_WRITE(data, "client_write(type=%x, len=%zu) -> %d",
                 type, blen, result);
  return result;
}